

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  int iVar2;
  int iVar3;
  ParsedOptions options;
  Crypt crypt;
  SequenceD<64> k1;
  SequenceD<64> local_138;
  Parser parser;
  
  Parser::Parser(&parser,argc,argv);
  Parser::parse(&options,&parser);
  if (options.error != false) {
    iVar3 = 1;
    goto switchD_00103f74_default;
  }
  iVar2 = 0;
  iVar3 = 0;
  switch(options.command) {
  case HELP:
    poVar1 = std::operator<<((ostream *)&std::cout,"Usage:");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "       3des [--key-gen] [-i <fichier>] [-c <fichier>] [-d <fichier>] [-O <fichier>]"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar1 = std::operator<<((ostream *)&std::cout,"Arguments:");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar1 = std::operator<<((ostream *)&std::cout,"  --key-gen");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "       Permet de generer une nouvelle clef de chiffrement et l\'affiche sur la sortie standard."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar1 = std::operator<<((ostream *)&std::cout,"  -i <fichier>");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "       Permet de specifier une clef utilisee pour le chiffrement ou le dechiffrement."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar1 = std::operator<<((ostream *)&std::cout,"  -c <fichier>");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "       Permet de chiffrer un fichier a l\'aide d\'une clef (specifiee par le flag -i)."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "       Par defaut, ecrit le resultat dans la sortie standard.");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar1 = std::operator<<((ostream *)&std::cout,"  -d <fichier>");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "       Permet de dechiffrer un fichier a l\'aide d\'une clef (specifiee par le flag -i)."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "       Par defaut, ecrit le resultat dans la sortie standard.");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar1 = std::operator<<((ostream *)&std::cout,"  -O <fichier>");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "      Permet d\'ecrire le resultat d\'une sous commande vers un nouveau fichier plutot que"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"      dans la sortie standard.");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar1 = std::operator<<((ostream *)&std::cout,"  -h / --help");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"      Affiche ce message d\'aide et se termine."
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar1 = std::operator<<((ostream *)&std::cout,"Exemple:");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "      ./3des -i ~/3des.key -c README.txt > README.3des");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    iVar3 = iVar2;
    break;
  case KEY_GEN:
    SequenceD<64>::SequenceD(&k1);
    SequenceD<64>::SequenceD(&crypt.m_k1);
    if (options.outputFile._M_string_length == 0) {
      write3DESKeys((ostream *)&std::cout,&k1,&crypt.m_k1);
    }
    else {
      write3DESKeys(&options.outputFile,&k1,&crypt.m_k1);
    }
    SequenceD<64>::~SequenceD(&crypt.m_k1);
    SequenceD<64>::~SequenceD(&k1);
    iVar3 = iVar2;
    break;
  case CYPHER:
    read3DESKeys((pair<SequenceD<64>,_SequenceD<64>_> *)&k1,&options.keyFile);
    Crypt::Crypt(&crypt,&k1,&local_138);
    if (options.outputFile._M_string_length == 0) {
      Crypt::operator()(&crypt,&options.inputFile,(ostream *)&std::cout);
    }
    else {
      Crypt::operator()(&crypt,&options.inputFile,&options.outputFile);
    }
    Crypt::~Crypt(&crypt);
    goto LAB_00104330;
  case DECYPHER:
    read3DESKeys((pair<SequenceD<64>,_SequenceD<64>_> *)&k1,&options.keyFile);
    Decrypt::Decrypt((Decrypt *)&crypt,&k1,&local_138);
    if (options.outputFile._M_string_length == 0) {
      Decrypt::operator()((Decrypt *)&crypt,&options.inputFile,(ostream *)&std::cout);
    }
    else {
      Decrypt::operator()((Decrypt *)&crypt,&options.inputFile,&options.outputFile);
    }
    Decrypt::~Decrypt((Decrypt *)&crypt);
LAB_00104330:
    std::pair<SequenceD<64>,_SequenceD<64>_>::~pair((pair<SequenceD<64>,_SequenceD<64>_> *)&k1);
    iVar3 = iVar2;
  }
switchD_00103f74_default:
  ParsedOptions::~ParsedOptions(&options);
  Parser::~Parser(&parser);
  return iVar3;
}

Assistant:

int main(int argc, char *argv[]) {
    Parser parser(argc, argv);
    auto options = parser.parse();

    if (options.error) {
        return EXIT_FAILURE;
    }

    switch (options.command) {
        case HELP:
            std::cout << "Usage:" << std::endl;
            std::cout << std::endl;
            std::cout << "       3des [--key-gen] [-i <fichier>] [-c <fichier>] [-d <fichier>] [-O <fichier>]" << std::endl;
            std::cout << std::endl;
            std::cout << "Arguments:" << std::endl;
            std::cout << std::endl;
            std::cout << "  --key-gen" << std::endl;
            std::cout << "       Permet de generer une nouvelle clef de chiffrement et l'affiche sur la sortie standard." << std::endl;
            std::cout << std::endl;
            std::cout << "  -i <fichier>" << std::endl;
            std::cout << "       Permet de specifier une clef utilisee pour le chiffrement ou le dechiffrement." << std::endl;
            std::cout << std::endl;
            std::cout << "  -c <fichier>" << std::endl;
            std::cout << "       Permet de chiffrer un fichier a l'aide d'une clef (specifiee par le flag -i)." << std::endl;
            std::cout << "       Par defaut, ecrit le resultat dans la sortie standard." << std::endl;
            std::cout << std::endl;
            std::cout << "  -d <fichier>" << std::endl;
            std::cout << "       Permet de dechiffrer un fichier a l'aide d'une clef (specifiee par le flag -i)." << std::endl;
            std::cout << "       Par defaut, ecrit le resultat dans la sortie standard." << std::endl;
            std::cout << std::endl;
            std::cout << "  -O <fichier>" << std::endl;
            std::cout << "      Permet d'ecrire le resultat d'une sous commande vers un nouveau fichier plutot que" << std::endl;
            std::cout << "      dans la sortie standard." << std::endl;
            std::cout << std::endl;
            std::cout << "  -h / --help" << std::endl;
            std::cout << "      Affiche ce message d'aide et se termine." << std::endl;
            std::cout << std::endl;
            std::cout << "Exemple:" << std::endl;
            std::cout << std::endl;
            std::cout << "      ./3des -i ~/3des.key -c README.txt > README.3des" << std::endl;
            std::cout << std::endl;
            break;
        case KEY_GEN: {
            SequenceD<64> k1{}, k2{};
            if (options.outputFile.empty()) {
                write3DESKeys(std::cout, k1, k2);
            } else {
                write3DESKeys(options.outputFile, k1, k2);
            }
        } break;
        case CYPHER: {
            auto [k1, k2] = read3DESKeys(options.keyFile);
            Crypt crypt(k1, k2);
            if (options.outputFile.empty()) {
                crypt(options.inputFile, std::cout);
            } else {
                crypt(options.inputFile, options.outputFile);
            }
        } break;
        case DECYPHER: {
            auto [k1, k2] = read3DESKeys(options.keyFile);
            Decrypt decrypt(k1, k2);
            if (options.outputFile.empty()) {
                decrypt(options.inputFile, std::cout);
            } else {
                decrypt(options.inputFile, options.outputFile);
            }
        } break;
        case NONE:
        default:
            break;
    }

    return EXIT_SUCCESS;
}